

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_declaration_statement(gravity_parser_t *parser)

{
  gtoken_s token;
  gravity_lexer_t *pgVar1;
  _Bool _Var2;
  char *pcVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  gtoken_s local_80;
  gtoken_s local_58;
  gtoken_t local_2c;
  gtoken_t local_28;
  gtoken_t storage_specifier;
  gtoken_t access_specifier;
  gtoken_t peek;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  _access_specifier = parser->lexer->p[parser->lexer->n - 1];
  lexer = (gravity_lexer_t *)parser;
  storage_specifier = gravity_lexer_peek(_access_specifier);
  local_28 = TOK_EOF;
  local_2c = TOK_EOF;
  _Var2 = token_isaccess_specifier(storage_specifier);
  if (_Var2) {
    local_28 = gravity_lexer_next(_access_specifier);
    storage_specifier = gravity_lexer_peek(_access_specifier);
  }
  _Var2 = token_isstorage_specifier(storage_specifier);
  if (_Var2) {
    local_2c = gravity_lexer_next(_access_specifier);
    storage_specifier = gravity_lexer_peek(_access_specifier);
  }
  pgVar1 = lexer;
  if ((storage_specifier == TOK_OP_SEMICOLON) && ((local_28 != TOK_EOF || (local_2c != TOK_EOF)))) {
    gravity_lexer_token(&local_58,_access_specifier);
    report_error((gravity_parser_t *)pgVar1,GRAVITY_ERROR_SYNTAX,0x170fb2);
  }
  pgVar1 = lexer;
  switch(storage_specifier) {
  case TOK_MACRO:
    parser_local = (gravity_parser_t *)parse_macro_statement((gravity_parser_t *)lexer);
    break;
  case TOK_KEY_FUNC:
    parser_local = (gravity_parser_t *)
                   parse_function_declaration((gravity_parser_t *)lexer,local_28,local_2c);
    break;
  default:
    gravity_lexer_token(&local_80,_access_specifier);
    pcVar3 = token_name(storage_specifier);
    token.lineno = local_80.lineno;
    token.type = local_80.type;
    token.colno = local_80.colno;
    token.position = local_80.position;
    token.bytes = local_80.bytes;
    token.length = local_80.length;
    token.fileid = local_80.fileid;
    token.builtin = local_80.builtin;
    token.value = local_80.value;
    report_error((gravity_parser_t *)pgVar1,GRAVITY_ERROR_SYNTAX,token,"Unrecognized token %s.",
                 pcVar3,in_R8,in_R9);
    parser_local = (gravity_parser_t *)0x0;
    break;
  case TOK_KEY_ENUM:
    parser_local = (gravity_parser_t *)
                   parse_enum_declaration((gravity_parser_t *)lexer,local_28,local_2c);
    break;
  case TOK_KEY_CLASS:
  case TOK_KEY_STRUCT:
    parser_local = (gravity_parser_t *)
                   parse_class_declaration((gravity_parser_t *)lexer,local_28,local_2c);
    break;
  case TOK_KEY_CONST:
  case TOK_KEY_VAR:
    parser_local = (gravity_parser_t *)
                   parse_variable_declaration((gravity_parser_t *)lexer,true,local_28,local_2c);
    break;
  case TOK_KEY_MODULE:
    parser_local = (gravity_parser_t *)
                   parse_module_declaration((gravity_parser_t *)lexer,local_28,local_2c);
    break;
  case TOK_KEY_EVENT:
    parser_local = (gravity_parser_t *)
                   parse_event_declaration((gravity_parser_t *)lexer,local_28,local_2c);
    break;
  case TOK_OP_SEMICOLON:
    parser_local = (gravity_parser_t *)parse_empty_statement((gravity_parser_t *)lexer);
  }
  return (gnode_t *)parser_local;
}

Assistant:

static gnode_t *parse_declaration_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_declaration_statement");

    DECLARE_LEXER;
    gtoken_t peek = gravity_lexer_peek(lexer);
    gtoken_t access_specifier = 0;    // 0 means no access specifier set
    gtoken_t storage_specifier = 0;    // 0 means no storage specifier set

    // check if an access specifier is set
    if (token_isaccess_specifier(peek)) {
        access_specifier = gravity_lexer_next(lexer);
        peek = gravity_lexer_peek(lexer);
    }

    // check if a storage specifier is set
    if (token_isstorage_specifier(peek)) {
        storage_specifier = gravity_lexer_next(lexer);
        peek = gravity_lexer_peek(lexer);
    }

    // it is a syntax error to specify an access or storage specifier followed by an empty declaration
    if ((peek == TOK_OP_SEMICOLON) && ((access_specifier) || (storage_specifier))) {
        REPORT_ERROR(gravity_lexer_token(lexer), "Access or storage specifier cannot be used here.");
    }

    switch (peek) {
        case TOK_MACRO: return parse_macro_statement(parser);
        case TOK_KEY_FUNC: return parse_function_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_ENUM: return parse_enum_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_MODULE: return parse_module_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_EVENT: return parse_event_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_CLASS:
        case TOK_KEY_STRUCT: return parse_class_declaration(parser, access_specifier, storage_specifier);
        case TOK_OP_SEMICOLON: return parse_empty_statement(parser);
        case TOK_KEY_VAR:
        case TOK_KEY_CONST: return parse_variable_declaration(parser, true, access_specifier, storage_specifier);
        default: REPORT_ERROR(gravity_lexer_token(lexer), "Unrecognized token %s.", token_name(peek)); return NULL;
    }

    // should never reach this point
    assert(0);
    return NULL;
}